

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void constructor(LexState *ls,expdesc *t)

{
  uint uVar1;
  FuncState *fs;
  Instruction *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ConsControl cc;
  
  fs = ls->fs;
  iVar5 = ls->linenumber;
  iVar3 = luaK_code(fs,10,fs->ls->lastline);
  cc.tostore = 0;
  cc.nh = 0;
  cc.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).s.info = iVar3;
  cc.v.t = -1;
  cc.v.f = -1;
  cc.v.k = VVOID;
  cc.v.u.s.info = 0;
  cc.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  do {
    do {
      iVar4 = (ls->t).token;
      if (iVar4 == 0x7d) goto LAB_0010cede;
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
        cc.v.k = VVOID;
        if (cc.tostore == 0x32) {
          luaK_setlist(fs,((cc.t)->u).s.info,cc.na,0x32);
          cc.tostore = 0;
        }
        iVar4 = (ls->t).token;
      }
      if (iVar4 == 0x5b) {
LAB_0010cea1:
        recfield(ls,&cc);
      }
      else {
        if (iVar4 == 0x11d) {
          iVar4 = llex(ls,&(ls->lookahead).seminfo);
          (ls->lookahead).token = iVar4;
          if (iVar4 == 0x3d) goto LAB_0010cea1;
        }
        listfield(ls,&cc);
      }
      iVar4 = testnext(ls,0x2c);
    } while (iVar4 != 0);
    iVar4 = testnext(ls,0x3b);
  } while (iVar4 != 0);
LAB_0010cede:
  check_match(ls,0x7d,0x7b,iVar5);
  if (cc.tostore != 0) {
    if (cc.v.k - VCALL < 2) {
      luaK_setreturns(fs,&cc.v,-1);
      luaK_setlist(fs,((cc.t)->u).s.info,cc.na,-1);
      cc.na = cc.na + -1;
    }
    else {
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
      }
      luaK_setlist(fs,((cc.t)->u).s.info,cc.na,cc.tostore);
    }
  }
  pIVar2 = fs->f->code;
  uVar1 = pIVar2[iVar3];
  iVar5 = luaO_int2fb(cc.na);
  pIVar2[iVar3] = iVar5 << 0x17 | uVar1 & 0x7fffff;
  uVar6 = luaO_int2fb(cc.nh);
  pIVar2[iVar3] = (uVar6 & 0x1ff) << 0xe | iVar5 << 0x17 | uVar1 & 0x3fff;
  return;
}

Assistant:

static void constructor(LexState*ls,expdesc*t){
FuncState*fs=ls->fs;
int line=ls->linenumber;
int pc=luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
struct ConsControl cc;
cc.na=cc.nh=cc.tostore=0;
cc.t=t;
init_exp(t,VRELOCABLE,pc);
init_exp(&cc.v,VVOID,0);
luaK_exp2nextreg(ls->fs,t);
checknext(ls,'{');
do{
if(ls->t.token=='}')break;
closelistfield(fs,&cc);
switch(ls->t.token){
case TK_NAME:{
luaX_lookahead(ls);
if(ls->lookahead.token!='=')
listfield(ls,&cc);
else
recfield(ls,&cc);
break;
}
case'[':{
recfield(ls,&cc);
break;
}
default:{
listfield(ls,&cc);
break;
}
}
}while(testnext(ls,',')||testnext(ls,';'));
check_match(ls,'}','{',line);
lastlistfield(fs,&cc);
SETARG_B(fs->f->code[pc],luaO_int2fb(cc.na));
SETARG_C(fs->f->code[pc],luaO_int2fb(cc.nh));
}